

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_until.hpp
# Opt level: O0

pair<asio::buffers_iterator<asio::const_buffers_1,_char>,_bool> * __thiscall
asio::detail::
partial_search<asio::buffers_iterator<asio::const_buffers_1,char>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (pair<asio::buffers_iterator<asio::const_buffers_1,_char>,_bool> *__return_storage_ptr__,
          detail *this,buffers_iterator<asio::const_buffers_1,_char> first1,
          buffers_iterator<asio::const_buffers_1,_char> last1,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          first2,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 last2)

{
  char cVar1;
  bool bVar2;
  reference pbVar3;
  reference pcVar4;
  bool local_93;
  bool local_92;
  bool local_91;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  test_iter2;
  buffers_iterator<asio::const_buffers_1,_char> test_iter1;
  buffers_iterator<asio::const_buffers_1,_char> iter1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last2_local;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first2_local;
  
  iter1.position_ = (size_t)first2._M_current;
  last2_local._M_current = (char *)this;
  memcpy(&test_iter1.position_,&first1,0x38);
  do {
    bVar2 = asio::operator!=((buffers_iterator<asio::const_buffers_1,_char> *)&test_iter1.position_,
                             &last1);
    if (!bVar2) {
      local_93 = false;
      std::make_pair<asio::buffers_iterator<asio::const_buffers_1,char>&,bool>
                (__return_storage_ptr__,&last1,&local_93);
      return __return_storage_ptr__;
    }
    memcpy(&test_iter2,&test_iter1.position_,0x38);
    local_90._M_current = last2_local._M_current;
    while( true ) {
      bVar2 = __gnu_cxx::operator==
                        (&local_90,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&iter1.position_);
      if (bVar2) {
        local_91 = true;
        std::make_pair<asio::buffers_iterator<asio::const_buffers_1,char>&,bool>
                  (__return_storage_ptr__,
                   (buffers_iterator<asio::const_buffers_1,_char> *)&test_iter1.position_,&local_91)
        ;
        return __return_storage_ptr__;
      }
      bVar2 = asio::operator==((buffers_iterator<asio::const_buffers_1,_char> *)&test_iter2,&last1);
      if (bVar2) break;
      pbVar3 = buffers_iterator<asio::const_buffers_1,_char>::operator*
                         ((buffers_iterator<asio::const_buffers_1,_char> *)&test_iter2);
      cVar1 = *pbVar3;
      pcVar4 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_90);
      if (cVar1 != *pcVar4) goto LAB_0014929a;
      buffers_iterator<asio::const_buffers_1,_char>::operator++
                ((buffers_iterator<asio::const_buffers_1,_char> *)&test_iter2);
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_90);
    }
    bVar2 = __gnu_cxx::operator!=(&local_90,&last2_local);
    if (bVar2) {
      local_92 = false;
      std::make_pair<asio::buffers_iterator<asio::const_buffers_1,char>&,bool>
                (__return_storage_ptr__,
                 (buffers_iterator<asio::const_buffers_1,_char> *)&test_iter1.position_,&local_92);
      return __return_storage_ptr__;
    }
LAB_0014929a:
    buffers_iterator<asio::const_buffers_1,_char>::operator++
              ((buffers_iterator<asio::const_buffers_1,_char> *)&test_iter1.position_);
  } while( true );
}

Assistant:

std::pair<Iterator1, bool> partial_search(
      Iterator1 first1, Iterator1 last1, Iterator2 first2, Iterator2 last2)
  {
    for (Iterator1 iter1 = first1; iter1 != last1; ++iter1)
    {
      Iterator1 test_iter1 = iter1;
      Iterator2 test_iter2 = first2;
      for (;; ++test_iter1, ++test_iter2)
      {
        if (test_iter2 == last2)
          return std::make_pair(iter1, true);
        if (test_iter1 == last1)
        {
          if (test_iter2 != first2)
            return std::make_pair(iter1, false);
          else
            break;
        }
        if (*test_iter1 != *test_iter2)
          break;
      }
    }
    return std::make_pair(last1, false);
  }